

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::MarshalAllPropertiesToScriptContext
          (PathTypeHandlerBase *this,DynamicObject *instance,ScriptContext *targetScriptContext,
          bool invalidateFixedFields)

{
  uint16 uVar1;
  PropertyId propertyId_00;
  ScriptContext *scriptContext_00;
  TypePath *this_00;
  PropertyRecord *this_01;
  Var pvVar2;
  undefined4 local_3c;
  int slotIndex;
  PropertyId propertyId;
  PropertyIndex propertyIndex;
  ScriptContext *scriptContext;
  int propertyCount;
  bool invalidateFixedFields_local;
  ScriptContext *targetScriptContext_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  uVar1 = GetPathLength(this);
  if (invalidateFixedFields) {
    scriptContext_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    for (slotIndex._2_2_ = 0; (uint)slotIndex._2_2_ < (uint)uVar1;
        slotIndex._2_2_ = slotIndex._2_2_ + 1) {
      this_00 = GetTypePath(this);
      this_01 = TypePath::GetPropertyIdUnchecked(this_00,(uint)slotIndex._2_2_);
      propertyId_00 = PropertyRecord::GetPropertyId(this_01);
      InvalidateFixedFieldAt(this,propertyId_00,slotIndex._2_2_,scriptContext_00);
    }
  }
  for (local_3c = 0; local_3c < (int)(uint)uVar1; local_3c = local_3c + 1) {
    pvVar2 = DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,local_3c);
    pvVar2 = CrossSite::MarshalVar(targetScriptContext,pvVar2,false);
    DynamicTypeHandler::SetSlotUnchecked(instance,local_3c,pvVar2);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::MarshalAllPropertiesToScriptContext(DynamicObject* instance, ScriptContext* targetScriptContext, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = GetPathLength();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                PropertyId propertyId = this->GetTypePath()->GetPropertyIdUnchecked(propertyIndex)->GetPropertyId();
                InvalidateFixedFieldAt(propertyId, propertyIndex, scriptContext);
            }
        }
#endif

        for (int slotIndex = 0; slotIndex < propertyCount; slotIndex++)
        {
            SetSlotUnchecked(instance, slotIndex, CrossSite::MarshalVar(targetScriptContext, GetSlot(instance, slotIndex)));
        }
    }